

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

void save_load(lda *l,io_buf *model_file,bool read,bool text)

{
  vw *all;
  bool bVar1;
  ostream *poVar2;
  size_t sVar3;
  weight *data;
  size_t sVar4;
  undefined7 in_register_00000009;
  uint uVar5;
  undefined7 in_register_00000011;
  bool bVar6;
  uint32_t *puVar7;
  bool read_00;
  ulong uVar8;
  ulong uVar9;
  uint64_t i;
  io_buf *local_1f8;
  undefined4 local_1ec;
  uint local_1e8;
  uint32_t j;
  vw *local_1e0;
  lda *local_1d8;
  version_struct *local_1d0;
  ulong local_1c8;
  parameters *local_1c0;
  initial_weights init;
  
  local_1ec = (undefined4)CONCAT71(in_register_00000009,text);
  uVar5 = (uint)CONCAT71(in_register_00000011,read);
  uVar8 = CONCAT71(in_register_00000011,read) & 0xffffffff;
  all = l->all;
  local_1c8 = (ulong)all->num_bits;
  local_1f8 = model_file;
  local_1d8 = l;
  if (uVar5 != 0) {
    initialize_regressor(all);
    init._initial = all->initial_t;
    init._lda = all->lda;
    init._initial_random =
         ((local_1d8->lda_D / (float)init._lda) / (float)(ulong)(1L << ((byte)all->num_bits & 0x3f))
         ) * 200.0;
    bVar6 = (all->weights).sparse;
    puVar7 = &(all->weights).dense_weights._stride_shift;
    if (bVar6 != false) {
      puVar7 = &(all->weights).sparse_weights._stride_shift;
    }
    init._stride = 1 << ((byte)*puVar7 & 0x1f);
    init._random = all->random_weights;
    if (bVar6 == true) {
      sparse_parameters::set_default<initial_weights,set_initial_lda_wrapper<sparse_parameters>>
                (&(all->weights).sparse_weights,&init);
    }
    else {
      dense_parameters::set_default<initial_weights,set_initial_lda_wrapper<dense_parameters>>
                (&(all->weights).dense_weights,&init);
    }
  }
  if ((local_1f8->files)._end != (local_1f8->files)._begin) {
    i = 0;
    std::__cxx11::stringstream::stringstream((stringstream *)&init);
    bVar6 = SUB41(local_1ec,0);
    read_00 = SUB81(uVar8,0);
    local_1d0 = &all->model_file_ver;
    local_1c0 = &all->weights;
    local_1e8 = uVar5;
    local_1e0 = all;
    do {
      while( true ) {
        uVar9 = (ulong)local_1e0->lda;
        if ((bVar6 ^ 1U) == 0 && read_00 == false) {
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&init._stride);
          std::operator<<(poVar2," ");
        }
        if (((char)uVar8 == '\0') || (bVar1 = version_struct::operator>=(local_1d0,"8.0.3"), bVar1))
        {
          sVar3 = bin_text_read_write_fixed
                            (local_1f8,(char *)&i,8,"",read_00,(stringstream *)&init,bVar6);
        }
        else {
          sVar3 = io_buf::bin_read_fixed(local_1f8,(char *)&j,4,"");
          i = (uint64_t)j;
        }
        if (sVar3 == 0) {
          sVar3 = 0;
        }
        else {
          data = parameters::strided_index(local_1c0,i);
          while (bVar1 = uVar9 != 0, uVar9 = uVar9 - 1, bVar1) {
            if ((bVar6 ^ 1U) == 0 && read_00 == false) {
              poVar2 = (ostream *)std::ostream::operator<<(&init._stride,*data + local_1d8->lda_rho)
              ;
              std::operator<<(poVar2," ");
            }
            sVar4 = bin_text_read_write_fixed
                              (local_1f8,(char *)data,4,"",read_00,(stringstream *)&init,bVar6);
            sVar3 = sVar3 + sVar4;
            data = data + 1;
          }
          uVar8 = (ulong)local_1e8;
        }
        if ((char)local_1ec != '\0') {
          if ((char)uVar8 == '\0') {
            std::operator<<((ostream *)&init._stride,"\n");
          }
          sVar4 = bin_text_read_write_fixed
                            (local_1f8,(char *)0x0,0,"",read_00,(stringstream *)&init,true);
          sVar3 = sVar3 + sVar4;
        }
        if ((char)uVar8 != '\0') break;
        i = i + 1;
        if (i >> ((byte)local_1c8 & 0x3f) != 0) goto LAB_0019be1a;
      }
    } while (sVar3 != 0);
LAB_0019be1a:
    std::__cxx11::stringstream::~stringstream((stringstream *)&init);
  }
  return;
}

Assistant:

void save_load(lda &l, io_buf &model_file, bool read, bool text)
{
  vw &all = *(l.all);
  uint64_t length = (uint64_t)1 << all.num_bits;
  if (read)
  {
    initialize_regressor(all);
    initial_weights init(all.initial_t, (float)(l.lda_D / all.lda / all.length() * 200), all.random_weights, all.lda,
        all.weights.stride());
    if (all.weights.sparse)
      all.weights.sparse_weights.set_default<initial_weights, set_initial_lda_wrapper<sparse_parameters>>(init);
    else
      all.weights.dense_weights.set_default<initial_weights, set_initial_lda_wrapper<dense_parameters>>(init);
  }
  if (model_file.files.size() > 0)
  {
    uint64_t i = 0;
    stringstream msg;
    size_t brw = 1;

    do
    {
      brw = 0;
      size_t K = all.lda;
      if (!read && text)
        msg << i << " ";

      if (!read || all.model_file_ver >= VERSION_FILE_WITH_HEADER_ID)
        brw += bin_text_read_write_fixed(model_file, (char *)&i, sizeof(i), "", read, msg, text);
      else
      {
        // support 32bit build models
        uint32_t j;
        brw += bin_text_read_write_fixed(model_file, (char *)&j, sizeof(j), "", read, msg, text);
        i = j;
      }

      if (brw != 0)
      {
        weight *w = &(all.weights.strided_index(i));
        for (uint64_t k = 0; k < K; k++)
        {
          weight *v = w + k;
          if (!read && text)
            msg << *v + l.lda_rho << " ";
          brw += bin_text_read_write_fixed(model_file, (char *)v, sizeof(*v), "", read, msg, text);
        }
      }
      if (text)
      {
        if (!read)
          msg << "\n";
        brw += bin_text_read_write_fixed(model_file, nullptr, 0, "", read, msg, text);
      }
      if (!read)
        ++i;
    } while ((!read && i < length) || (read && brw > 0));
  }
}